

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_parse_http(char *s,int n,http_message *hm,int is_req)

{
  byte *end;
  char *__s;
  size_t __n;
  ulong uVar1;
  uint len;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  void *pvVar5;
  size_t sVar6;
  size_t n1;
  
  len = get_request_len(s,n);
  if ((int)len < 1) {
    return len;
  }
  memset(&hm->method,0,0x558);
  (hm->message).p = s;
  end = (byte *)(s + len);
  (hm->body).p = (char *)end;
  (hm->body).len = 0xffffffffffffffff;
  (hm->message).len = 0xffffffffffffffff;
  ppuVar3 = __ctype_b_loc();
  do {
    if ((*(byte *)((long)*ppuVar3 + (ulong)(byte)*s * 2 + 1) & 0x20) == 0) break;
    s = (char *)((byte *)s + 1);
  } while (s < end);
  if (is_req == 0) {
    pcVar4 = mg_skip(s,(char *)end," ",&hm->proto);
    if ((long)end - (long)pcVar4 < 4) {
      return -1;
    }
    if (pcVar4[3] != ' ') {
      return -1;
    }
    iVar2 = atoi(pcVar4);
    hm->resp_code = iVar2;
    if (iVar2 - 600U < 0xfffffe0c) {
      return -1;
    }
    pcVar4 = mg_skip(pcVar4 + 4,(char *)end,"\r\n",&hm->resp_status_msg);
  }
  else {
    pcVar4 = mg_skip(s,(char *)end," ",&hm->method);
    pcVar4 = mg_skip(pcVar4,(char *)end," ",&hm->uri);
    pcVar4 = mg_skip(pcVar4,(char *)end,"\r\n",&hm->proto);
    __s = (hm->uri).p;
    if (__s <= (hm->method).p) {
      return -1;
    }
    if ((hm->proto).p <= __s) {
      return -1;
    }
    __n = (hm->uri).len;
    pvVar5 = memchr(__s,0x3f,__n);
    if (pvVar5 != (void *)0x0) {
      (hm->query_string).p = (char *)((long)pvVar5 + 1);
      (hm->query_string).len = (size_t)(__s + (__n - ((long)pvVar5 + 1)));
      (hm->uri).len = (long)pvVar5 - (long)__s;
    }
  }
  parse_http_headers(pcVar4,(char *)end,len,hm);
  if ((is_req != 0) && ((hm->body).len == 0xffffffffffffffff)) {
    pcVar4 = (hm->method).p;
    uVar1 = (hm->method).len;
    sVar6 = 3;
    if (uVar1 < 3) {
      sVar6 = uVar1;
    }
    iVar2 = mg_ncasecmp(pcVar4,"PUT",sVar6);
    if (((uVar1 & 0xffffffff) != 3) || (iVar2 != 0)) {
      sVar6 = 4;
      if (uVar1 < 4) {
        sVar6 = uVar1;
      }
      iVar2 = mg_ncasecmp(pcVar4,"POST",sVar6);
      if (((int)uVar1 != 4) || (iVar2 != 0)) {
        (hm->body).len = 0;
        (hm->message).len = (ulong)len;
      }
    }
  }
  return len;
}

Assistant:

int mg_parse_http(const char *s, int n, struct http_message *hm, int is_req) {
    const char *end, *qs;
    int len = get_request_len(s, n);

    if (len <= 0) return len;

    memset(hm, 0, sizeof(*hm));
    hm->message.p = s;
    hm->body.p = s + len;
    hm->message.len = hm->body.len = (size_t) ~0;
    end = s + len;

    /* Request is fully buffered. Skip leading whitespaces. */
    while (s < end && isspace(*(unsigned char *) s)) s++;

    if (is_req) {
        /* Parse request line: method, URI, proto */
        s = mg_skip(s, end, " ", &hm->method);
        s = mg_skip(s, end, " ", &hm->uri);
        s = mg_skip(s, end, "\r\n", &hm->proto);
        if (hm->uri.p <= hm->method.p || hm->proto.p <= hm->uri.p) return -1;

        /* If URI contains '?' character, initialize query_string */
        if ((qs = (char *) memchr(hm->uri.p, '?', hm->uri.len)) != NULL) {
            hm->query_string.p = qs + 1;
            hm->query_string.len = &hm->uri.p[hm->uri.len] - (qs + 1);
            hm->uri.len = qs - hm->uri.p;
        }
    } else {
        s = mg_skip(s, end, " ", &hm->proto);
        if (end - s < 4 || s[3] != ' ') return -1;
        hm->resp_code = atoi(s);
        if (hm->resp_code < 100 || hm->resp_code >= 600) return -1;
        s += 4;
        s = mg_skip(s, end, "\r\n", &hm->resp_status_msg);
    }

    s = parse_http_headers(s, end, len, hm);

    /*
   * mg_parse_http() is used to parse both HTTP requests and HTTP
   * responses. If HTTP response does not have Content-Length set, then
   * body is read until socket is closed, i.e. body.len is infinite (~0).
   *
   * For HTTP requests though, according to
   * http://tools.ietf.org/html/rfc7231#section-8.1.3,
   * only POST and PUT methods have defined body semantics.
   * Therefore, if Content-Length is not specified and methods are
   * not one of PUT or POST, set body length to 0.
   *
   * So,
   * if it is HTTP request, and Content-Length is not set,
   * and method is not (PUT or POST) then reset body length to zero.
   */
    if (hm->body.len == (size_t) ~0 && is_req &&
        mg_vcasecmp(&hm->method, "PUT") != 0 &&
        mg_vcasecmp(&hm->method, "POST") != 0) {
        hm->body.len = 0;
        hm->message.len = len;
    }

    return len;
}